

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaReleaseMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  MessageFactory *pMVar1;
  int iVar2;
  Extension *pEVar3;
  LogMessage *pLVar4;
  Descriptor *pDVar5;
  MessageLite *pMVar6;
  LogMessage local_b0;
  LogMessage local_78;
  MessageFactory *local_40;
  LogFinisher local_31;
  
  pEVar3 = FindOrNull(this,*(int *)(descriptor + 0x44));
  if (pEVar3 == (Extension *)0x0) {
    pMVar6 = (MessageLite *)0x0;
  }
  else {
    local_40 = factory;
    if (pEVar3->is_repeated == true) {
      LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set_heavy.cc"
                 ,0xe4);
      pLVar4 = LogMessage::operator<<
                         (&local_b0,
                          "CHECK failed: ((*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_OPTIONAL): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_78,pLVar4);
      LogMessage::~LogMessage(&local_b0);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pEVar3->type * 4) != 10) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set_heavy.cc"
                 ,0xe4);
      pLVar4 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: (cpp_type((*extension).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_31,pLVar4);
      LogMessage::~LogMessage(&local_78);
    }
    pMVar1 = local_40;
    pMVar6 = (MessageLite *)(pEVar3->field_0).repeated_string_value;
    if ((pEVar3->field_0xa & 0x10) != 0) {
      pDVar5 = FieldDescriptor::message_type(descriptor);
      iVar2 = (*pMVar1->_vptr_MessageFactory[2])(pMVar1,pDVar5);
      pMVar6 = (MessageLite *)
               (*(code *)(((RepeatedPtrFieldBase *)&pMVar6->_vptr_MessageLite)->arena_->impl_).
                         options_.initial_block_size)(pMVar6,iVar2);
      if ((this->arena_ == (Arena *)0x0) &&
         ((pEVar3->field_0).repeated_string_value !=
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0)) {
        (*(code *)(((((pEVar3->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)
                  ->impl_).hint_._M_b._M_p)();
      }
    }
    Erase(this,*(int *)(descriptor + 0x44));
  }
  return pMVar6;
}

Assistant:

MessageLite* ExtensionSet::UnsafeArenaReleaseMessage(
    const FieldDescriptor* descriptor, MessageFactory* factory) {
  Extension* extension = FindOrNull(descriptor->number());
  if (extension == NULL) {
    // Not present.  Return NULL.
    return NULL;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    MessageLite* ret = NULL;
    if (extension->is_lazy) {
      ret = extension->lazymessage_value->UnsafeArenaReleaseMessage(
          *factory->GetPrototype(descriptor->message_type()));
      if (arena_ == NULL) {
        delete extension->lazymessage_value;
      }
    } else {
      ret = extension->message_value;
    }
    Erase(descriptor->number());
    return ret;
  }
}